

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<signed_char,long>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<signed_char,long>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b1 = LessThanTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b1);
    }
  }
  if (ComparisonTestTU<signed_char,long>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b2 = LessThanEqualTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b2);
    }
  }
  if (ComparisonTestTU<signed_char,long>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b3 = GreaterThanTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b3);
    }
  }
  if (ComparisonTestTU<signed_char,long>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b4 = GreaterThanEqualTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b4);
    }
  }
  if (ComparisonTestTU<signed_char,long>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b5 = EqualTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b5);
    }
  }
  if (ComparisonTestTU<signed_char,long>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,long>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_long>::b6 = NotEqualTest<signed_char,long>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,long>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}